

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modl.c
# Opt level: O0

void show_options(char **argv)

{
  undefined8 *in_RDI;
  
  fprintf(_stderr,"Source to source compiler from NMODL to C\n");
  fprintf(_stderr,"Usage: %s [options] Inputfile\n",*in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,
          "\t-o | --outdir <OUTPUT_DIRECTORY>    directory where output files will be written\n");
  fprintf(_stderr,"\t-h | --help                         print this message\n");
  fprintf(_stderr,"\t-v | --version                      print version number\n");
  return;
}

Assistant:

static void show_options(char** argv) {
  fprintf(stderr, "Source to source compiler from NMODL to C\n");
  fprintf(stderr, "Usage: %s [options] Inputfile\n", argv[0]);
  fprintf(stderr, "Options:\n");
  fprintf(stderr, "\t-o | --outdir <OUTPUT_DIRECTORY>    directory where output files will be written\n");
  fprintf(stderr, "\t-h | --help                         print this message\n");
  fprintf(stderr, "\t-v | --version                      print version number\n");
}